

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTests(Config *config)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  TestSpec *pTVar4;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *config_00;
  reference pTVar5;
  ostream *poVar6;
  long *in_RDI;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  TestCase *testCaseInfo;
  int current_test;
  iterator it;
  int end_offset;
  int start_offset;
  size_type total_tests_run;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  TestSpec testSpec;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_fffffffffffffed8;
  __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  *in_stack_fffffffffffffee0;
  TestSpec *in_stack_fffffffffffffee8;
  TestSpec *in_stack_fffffffffffffef0;
  TestCaseInfo *in_stack_ffffffffffffff48;
  int local_7c;
  __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_78;
  int local_70;
  int local_6c;
  size_type local_68;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_60 [3];
  long *local_8;
  
  local_8 = in_RDI;
  (**(code **)(*in_RDI + 0x68))();
  TestSpec::TestSpec(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  poVar3 = cout();
  pTVar4 = (TestSpec *)std::operator<<((ostream *)poVar3,"name\tgroup");
  std::ostream::operator<<(pTVar4,std::endl<char,std::char_traits<char>>);
  config_00 = getAllTestCasesSorted((IConfig *)0x261714);
  filterTests((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)poVar3,pTVar4,
              (IConfig *)config_00);
  local_68 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size(local_60);
  local_6c = 0;
  local_70 = (int)local_68;
  iVar2 = (**(code **)(*local_8 + 0x98))();
  if (iVar2 < 0) {
    iVar2 = (**(code **)(*local_8 + 0xa0))();
    if (-1 < iVar2) {
      iVar2 = (**(code **)(*local_8 + 0xa0))();
      auVar7._8_4_ = (int)(local_68 >> 0x20);
      auVar7._0_8_ = local_68;
      auVar7._12_4_ = 0x45300000;
      local_6c = (int)(((double)iVar2 / 100.0) *
                      ((auVar7._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0)));
    }
  }
  else {
    local_6c = (**(code **)(*local_8 + 0x98))();
  }
  iVar2 = (**(code **)(*local_8 + 0xa8))();
  if (iVar2 < 0) {
    iVar2 = (**(code **)(*local_8 + 0xb0))();
    if (-1 < iVar2) {
      iVar2 = (**(code **)(*local_8 + 0xb0))();
      auVar8._8_4_ = (int)(local_68 >> 0x20);
      auVar8._0_8_ = local_68;
      auVar8._12_4_ = 0x45300000;
      local_70 = (int)(((double)iVar2 / 100.0) *
                      ((auVar8._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0)));
    }
  }
  else {
    local_70 = (**(code **)(*local_8 + 0xa8))();
  }
  local_78._M_current =
       (TestCase *)
       clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 (in_stack_fffffffffffffed8);
  local_7c = 0;
  while( true ) {
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
              (in_stack_fffffffffffffed8);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffee0,
                       (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)in_stack_fffffffffffffed8);
    if (!bVar1) break;
    if ((local_7c < local_6c) || (local_70 <= local_7c)) {
      __gnu_cxx::
      __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
      ::operator++((__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                    *)in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
    }
    else {
      pTVar5 = __gnu_cxx::
               __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*(&local_78);
      poVar3 = cout();
      poVar6 = std::operator<<((ostream *)poVar3,(string *)pTVar5);
      std::operator<<(poVar6,anon_var_dwarf_65ec0d + 7);
      bVar1 = clara::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffef0);
      if (!bVar1) {
        in_stack_fffffffffffffef0 = (TestSpec *)cout();
        TestCaseInfo::tagsAsString_abi_cxx11_(in_stack_ffffffffffffff48);
        std::operator<<((ostream *)in_stack_fffffffffffffef0,(string *)&stack0xffffffffffffff48);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
      }
      in_stack_fffffffffffffee8 = (TestSpec *)cout();
      std::ostream::operator<<(in_stack_fffffffffffffee8,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
      ::operator++((__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                    *)in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
    }
    local_7c = local_7c + 1;
  }
  pTVar4 = (TestSpec *)
           clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size(local_60);
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_fffffffffffffef0)
  ;
  TestSpec::~TestSpec(pTVar4);
  return (size_t)pTVar4;
}

Assistant:

std::size_t listTests( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        Catch::cout() << "name\tgroup" << std::endl;

        auto matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        auto total_tests_run = matchedTestCases.size();
        int start_offset = 0;
        int end_offset = total_tests_run;
        if (config.startOffset() >= 0) {
            start_offset = config.startOffset();
        } else if (config.startOffsetPercentage() >= 0) {
            start_offset = int((config.startOffsetPercentage() / 100.0) * total_tests_run);
        }
        if (config.endOffset() >= 0) {
            end_offset = config.endOffset();
        } else if (config.endOffsetPercentage() >= 0) {
            end_offset = int((config.endOffsetPercentage() / 100.0) * total_tests_run);
        }
        auto it = matchedTestCases.begin();
        for(int current_test = 0; it != matchedTestCases.end(); current_test++) {
            if (current_test < start_offset || current_test >= end_offset) {
                // skip this test
                it++;
                continue;
            }
            auto &testCaseInfo = *it;
            Catch::cout() << testCaseInfo.name << "\t";
            if( !testCaseInfo.tags.empty() ) {
                Catch::cout() << testCaseInfo.tagsAsString();
            }
            Catch::cout() << std::endl;
            it++;
        }
        return matchedTestCases.size();
    }